

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

void cimg_library::CImg<unsigned_char>::_load_inr_header(FILE *file,int *out,float *voxel_size)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  CImgIOException *this;
  long lVar5;
  char cVar6;
  char cVar7;
  CImg<char> item;
  CImg<char> tmp1;
  CImg<char> tmp2;
  CImg<char> local_c8;
  int *local_a8;
  int *local_a0;
  int *local_98;
  int *local_90;
  FILE *local_88;
  CImg<char> local_80;
  CImg<char> local_60;
  float *local_40;
  float *local_38;
  
  local_88 = file;
  CImg<char>::CImg(&local_c8,0x400,1,1,1);
  CImg<char>::CImg(&local_80,0x40,1,1,1);
  CImg<char>::CImg(&local_60,0x40,1,1,1);
  *local_60._data = '\0';
  *local_80._data = '\0';
  *local_c8._data = '\0';
  __isoc99_fscanf(local_88,"%63s",local_c8._data);
  out[5] = 1;
  out[3] = 1;
  out[4] = -1;
  out[1] = 1;
  out[2] = 1;
  *out = 1;
  out[6] = -1;
  out[7] = -1;
  if (local_c8._data != (char *)0x0) {
    local_a0 = out + 3;
    local_90 = out + 2;
    local_98 = out + 1;
    local_a8 = out + 6;
    lVar5 = 0;
    do {
      cVar1 = local_c8._data[lVar5];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "#INRIMAGE-4#{"[lVar5];
      cVar7 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar7 = cVar1;
      }
      if (cVar6 != cVar7) goto LAB_001ade99;
      lVar5 = lVar5 + 1;
    } while ((int)lVar5 != 0xd);
    lVar5 = 0xd;
LAB_001ade99:
    if (cVar6 == cVar7 || (int)lVar5 == 0xd) {
      local_38 = voxel_size + 1;
      local_40 = voxel_size + 2;
      do {
        do {
          iVar3 = __isoc99_fscanf(local_88," %63[^\n]%*c",local_c8._data);
          pcVar2 = local_c8._data;
          if (iVar3 == -1) {
LAB_001ae33e:
            if ((((*out < 0) || (*local_98 < 0)) || (*local_90 < 0)) || (*local_a0 < 0)) {
              this = (CImgIOException *)__cxa_allocate_exception(0x10);
              CImgIOException::CImgIOException
                        (this,
                         "CImg<%s>::load_inr(): Invalid dimensions (%d,%d,%d,%d) defined in header."
                         ,"unsigned char",(ulong)(uint)*out,(ulong)(uint)out[1],(ulong)(uint)out[2],
                         out[3]);
            }
            else if ((out[4] < 0) || (out[5] < 0)) {
              this = (CImgIOException *)__cxa_allocate_exception(0x10);
              CImgIOException::CImgIOException
                        (this,"CImg<%s>::load_inr(): Incomplete pixel type defined in header.",
                         "unsigned char");
            }
            else if (*local_a8 < 0) {
              this = (CImgIOException *)__cxa_allocate_exception(0x10);
              CImgIOException::CImgIOException
                        (this,"CImg<%s>::load_inr(): Incomplete PIXSIZE field defined in header.",
                         "unsigned char");
            }
            else {
              if (-1 < out[7]) {
                if ((local_60._is_shared == false) && (local_60._data != (char *)0x0)) {
                  operator_delete__(local_60._data);
                }
                if ((local_80._is_shared == false) && (local_80._data != (char *)0x0)) {
                  operator_delete__(local_80._data);
                }
                if ((local_c8._is_shared == false) && (local_c8._data != (char *)0x0)) {
                  operator_delete__(local_c8._data);
                }
                return;
              }
              this = (CImgIOException *)__cxa_allocate_exception(0x10);
              CImgIOException::CImgIOException
                        (this,
                         "CImg<%s>::load_inr(): Big/Little Endian coding type undefined in header.",
                         "unsigned char");
            }
            goto LAB_001ae4cb;
          }
          iVar3 = strncmp(local_c8._data,"##}",3);
          if (iVar3 == 0) goto LAB_001ae33e;
          __isoc99_sscanf(pcVar2," XDIM%*[^0-9]%d",out);
          __isoc99_sscanf(local_c8._data," YDIM%*[^0-9]%d",local_98);
          __isoc99_sscanf(local_c8._data," ZDIM%*[^0-9]%d",local_90);
          __isoc99_sscanf(local_c8._data," VDIM%*[^0-9]%d",local_a0);
          __isoc99_sscanf(local_c8._data," PIXSIZE%*[^0-9]%d",local_a8);
          if (voxel_size != (float *)0x0) {
            __isoc99_sscanf(local_c8._data," VX%*[^0-9.+-]%f",voxel_size);
            __isoc99_sscanf(local_c8._data," VY%*[^0-9.+-]%f",local_38);
            __isoc99_sscanf(local_c8._data," VZ%*[^0-9.+-]%f",local_40);
          }
          iVar3 = __isoc99_sscanf(local_c8._data," CPU%*[ =]%s",local_80._data);
          if (iVar3 != 0) {
            if (local_80._data == (char *)0x0) {
              uVar4 = 0;
            }
            else {
              lVar5 = 0;
              do {
                cVar1 = local_80._data[lVar5];
                cVar6 = cVar1 + ' ';
                if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                  cVar6 = cVar1;
                }
                cVar1 = "sun"[lVar5];
                cVar7 = cVar1 + ' ';
                if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                  cVar7 = cVar1;
                }
                if (cVar6 != cVar7) goto LAB_001ae05b;
                lVar5 = lVar5 + 1;
              } while ((int)lVar5 != 3);
              lVar5 = 3;
LAB_001ae05b:
              uVar4 = (uint)(cVar6 == cVar7 || (int)lVar5 == 3);
            }
            out[7] = uVar4;
          }
          iVar3 = __isoc99_sscanf(local_c8._data," TYPE%*[ =]%s %s",local_80._data);
        } while (iVar3 == 0);
        if (iVar3 != 1) {
          if (iVar3 != 2) break;
          if (local_80._data == (char *)0x0) {
            uVar4 = 1;
          }
          else {
            lVar5 = 0;
            do {
              cVar1 = local_80._data[lVar5];
              cVar6 = cVar1 + ' ';
              if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                cVar6 = cVar1;
              }
              cVar1 = "unsigned"[lVar5];
              cVar7 = cVar1 + ' ';
              if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                cVar7 = cVar1;
              }
              if (cVar6 != cVar7) goto LAB_001ae0fb;
              lVar5 = lVar5 + 1;
            } while ((int)lVar5 != 8);
            lVar5 = 8;
LAB_001ae0fb:
            uVar4 = (uint)(cVar6 != cVar7 && (int)lVar5 != 8);
          }
          out[5] = uVar4;
          strncpy(local_80._data,local_60._data,(ulong)(local_80._width - 1));
        }
        if (local_80._data != (char *)0x0) {
          lVar5 = 0;
          do {
            cVar1 = local_80._data[lVar5];
            cVar6 = cVar1 + ' ';
            if ((byte)(cVar1 + 0xa5U) < 0xe6) {
              cVar6 = cVar1;
            }
            cVar1 = "unsigned int"[lVar5 + 9];
            cVar7 = cVar1 + ' ';
            if ((byte)(cVar1 + 0xa5U) < 0xe6) {
              cVar7 = cVar1;
            }
            if (cVar6 != cVar7) goto LAB_001ae175;
            lVar5 = lVar5 + 1;
          } while ((int)lVar5 != 3);
          lVar5 = 3;
LAB_001ae175:
          if (cVar6 == cVar7 || (int)lVar5 == 3) {
LAB_001ae1dd:
            out[4] = 0;
          }
          else {
            if (local_80._data == (char *)0x0) goto LAB_001ae302;
            lVar5 = 0;
            do {
              cVar1 = local_80._data[lVar5];
              cVar6 = cVar1 + ' ';
              if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                cVar6 = cVar1;
              }
              cVar1 = "fixed"[lVar5];
              cVar7 = cVar1 + ' ';
              if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                cVar7 = cVar1;
              }
              if (cVar6 != cVar7) goto LAB_001ae1cd;
              lVar5 = lVar5 + 1;
            } while ((int)lVar5 != 5);
            lVar5 = 5;
LAB_001ae1cd:
            if (cVar6 == cVar7 || (int)lVar5 == 5) goto LAB_001ae1dd;
          }
          if (local_80._data != (char *)0x0) {
            lVar5 = 0;
            do {
              cVar1 = local_80._data[lVar5];
              cVar6 = cVar1 + ' ';
              if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                cVar6 = cVar1;
              }
              cVar1 = "GL_NV_shader_atomic_float"[lVar5 + 0x14];
              cVar7 = cVar1 + ' ';
              if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                cVar7 = cVar1;
              }
              if (cVar6 != cVar7) goto LAB_001ae22c;
              lVar5 = lVar5 + 1;
            } while ((int)lVar5 != 5);
            lVar5 = 5;
LAB_001ae22c:
            if (cVar6 == cVar7 || (int)lVar5 == 5) {
LAB_001ae29a:
              out[4] = 1;
            }
            else {
              if (local_80._data == (char *)0x0) goto LAB_001ae302;
              lVar5 = 0;
              do {
                cVar1 = local_80._data[lVar5];
                cVar6 = cVar1 + ' ';
                if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                  cVar6 = cVar1;
                }
                cVar1 = "double"[lVar5];
                cVar7 = cVar1 + ' ';
                if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                  cVar7 = cVar1;
                }
                if (cVar6 != cVar7) goto LAB_001ae28a;
                lVar5 = lVar5 + 1;
              } while ((int)lVar5 != 6);
              lVar5 = 6;
LAB_001ae28a:
              if (cVar6 == cVar7 || (int)lVar5 == 6) goto LAB_001ae29a;
            }
            if (local_80._data != (char *)0x0) {
              lVar5 = 0;
              do {
                cVar1 = local_80._data[lVar5];
                cVar6 = cVar1 + ' ';
                if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                  cVar6 = cVar1;
                }
                cVar1 = "packed"[lVar5];
                cVar7 = cVar1 + ' ';
                if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                  cVar7 = cVar1;
                }
                if (cVar6 != cVar7) goto LAB_001ae2eb;
                lVar5 = lVar5 + 1;
              } while ((int)lVar5 != 6);
              lVar5 = 6;
LAB_001ae2eb:
              if (cVar6 == cVar7 || (int)lVar5 == 6) {
                out[4] = 2;
              }
            }
          }
        }
LAB_001ae302:
      } while (-1 < out[4]);
      this = (CImgIOException *)__cxa_allocate_exception(0x10);
      CImgIOException::CImgIOException
                (this,"CImg<%s>::load_inr(): Invalid pixel type \'%s\' defined in header.",
                 "unsigned char",local_60._data);
      goto LAB_001ae4cb;
    }
  }
  this = (CImgIOException *)__cxa_allocate_exception(0x10);
  CImgIOException::CImgIOException
            (this,"CImg<%s>::load_inr(): INRIMAGE-4 header not found.","unsigned char");
LAB_001ae4cb:
  __cxa_throw(this,&CImgIOException::typeinfo,CImgException::~CImgException);
}

Assistant:

static void _load_inr_header(std::FILE *file, int out[8], float *const voxel_size) {
      CImg<charT> item(1024), tmp1(64), tmp2(64);
      *item = *tmp1 = *tmp2 = 0;
      out[0] = std::fscanf(file,"%63s",item._data);
      out[0] = out[1] = out[2] = out[3] = out[5] = 1; out[4] = out[6] = out[7] = -1;
      if (cimg::strncasecmp(item,"#INRIMAGE-4#{",13)!=0)
        throw CImgIOException("CImg<%s>::load_inr(): INRIMAGE-4 header not found.",
                              pixel_type());

      while (std::fscanf(file," %63[^\n]%*c",item._data)!=EOF && std::strncmp(item,"##}",3)) {
        cimg_sscanf(item," XDIM%*[^0-9]%d",out);
        cimg_sscanf(item," YDIM%*[^0-9]%d",out + 1);
        cimg_sscanf(item," ZDIM%*[^0-9]%d",out + 2);
        cimg_sscanf(item," VDIM%*[^0-9]%d",out + 3);
        cimg_sscanf(item," PIXSIZE%*[^0-9]%d",out + 6);
        if (voxel_size) {
          cimg_sscanf(item," VX%*[^0-9.+-]%f",voxel_size);
          cimg_sscanf(item," VY%*[^0-9.+-]%f",voxel_size + 1);
          cimg_sscanf(item," VZ%*[^0-9.+-]%f",voxel_size + 2);
        }
        if (cimg_sscanf(item," CPU%*[ =]%s",tmp1._data)) out[7] = cimg::strncasecmp(tmp1,"sun",3)?0:1;
        switch (cimg_sscanf(item," TYPE%*[ =]%s %s",tmp1._data,tmp2._data)) {
        case 0 : break;
        case 2 :
          out[5] = cimg::strncasecmp(tmp1,"unsigned",8)?1:0;
          std::strncpy(tmp1,tmp2,tmp1._width - 1); // fallthrough
        case 1 :
          if (!cimg::strncasecmp(tmp1,"int",3) || !cimg::strncasecmp(tmp1,"fixed",5))  out[4] = 0;
          if (!cimg::strncasecmp(tmp1,"float",5) || !cimg::strncasecmp(tmp1,"double",6)) out[4] = 1;
          if (!cimg::strncasecmp(tmp1,"packed",6)) out[4] = 2;
          if (out[4]>=0) break; // fallthrough
        default :
          throw CImgIOException("CImg<%s>::load_inr(): Invalid pixel type '%s' defined in header.",
                                pixel_type(),
                                tmp2._data);
        }
      }
      if (out[0]<0 || out[1]<0 || out[2]<0 || out[3]<0)
        throw CImgIOException("CImg<%s>::load_inr(): Invalid dimensions (%d,%d,%d,%d) defined in header.",
                              pixel_type(),
                              out[0],out[1],out[2],out[3]);
      if (out[4]<0 || out[5]<0)
        throw CImgIOException("CImg<%s>::load_inr(): Incomplete pixel type defined in header.",
                              pixel_type());
      if (out[6]<0)
        throw CImgIOException("CImg<%s>::load_inr(): Incomplete PIXSIZE field defined in header.",
                              pixel_type());
      if (out[7]<0)
        throw CImgIOException("CImg<%s>::load_inr(): Big/Little Endian coding type undefined in header.",
                              pixel_type());
    }